

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void clunk::InitKingMoves(int from)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint64_t map;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x24c,"void clunk::InitKingMoves(const int)");
  }
  lVar3 = 0;
  map = 0;
  iVar4 = 0;
  do {
    uVar1 = *(int *)((long)&DAT_0014e800 + lVar3) + from;
    if ((uVar1 & 0xffffff88) == 0) {
      if ((from & 0xffffff88U) != 0) {
        __assert_fail("IS_SQUARE(from)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x106,"int clunk::Direction(const int, const int)");
      }
      if (*(int *)((long)&DAT_0014e800 + lVar3) !=
          (int)(char)(&_dir)[(ulong)uVar1 + (ulong)(uint)from * 0x80]) {
        __assert_fail("Direction(from, to) == dir[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x256,"void clunk::InitKingMoves(const int)");
      }
      if (0x38 < iVar4) {
        __assert_fail("shift <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,599,"void clunk::InitKingMoves(const int)");
      }
      map = map | (ulong)uVar1 + 1 << ((byte)iVar4 & 0x3f);
      iVar4 = iVar4 + 8;
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 0x20) {
      bVar2 = VerifyMoveMap(from,map);
      if (bVar2) {
        *(uint64_t *)(&DAT_0016ac80 + (ulong)(uint)from * 8) = map;
        return;
      }
      __assert_fail("VerifyMoveMap(from, mvs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x25c,"void clunk::InitKingMoves(const int)");
    }
  } while( true );
}

Assistant:

void InitKingMoves(const int from) {
  assert(IS_SQUARE(from));
  const int dir[8] = {
    SouthWest, South, SouthEast, West,
    East, NorthWest, North, NorthEast
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 8; ++i) {
    const int to = (from + dir[i]);
    if (IS_SQUARE(to)) {
      assert(Direction(from, to) == dir[i]);
      assert(shift <= 56);
      mvs |= (uint64_t(to + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _queenKing[from + 8] = mvs;
}